

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

bool pbrt::HasExtension(string *filename,string *e)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  string ext;
  string filenameExtension;
  path local_58;
  
  std::__cxx11::string::string((string *)&ext,(string *)e);
  if ((ext._M_string_length != 0) && (*ext._M_dataplus._M_p == '.')) {
    std::__cxx11::string::erase((ulong)&ext,0);
  }
  filesystem::path::path(&local_58,filename);
  filesystem::path::extension_abi_cxx11_(&filenameExtension,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.m_path);
  if (filenameExtension._M_string_length < ext._M_string_length) {
    bVar5 = false;
  }
  else {
    lVar4 = 0;
    do {
      bVar5 = -lVar4 == ext._M_string_length;
      if (bVar5) break;
      cVar1 = filenameExtension._M_dataplus._M_p[lVar4 + (filenameExtension._M_string_length - 1)];
      iVar2 = tolower((int)ext._M_dataplus._M_p[lVar4 + (ext._M_string_length - 1)]);
      iVar3 = tolower((int)cVar1);
      lVar4 = lVar4 + -1;
    } while (iVar2 == iVar3);
  }
  std::__cxx11::string::~string((string *)&filenameExtension);
  std::__cxx11::string::~string((string *)&ext);
  return bVar5;
}

Assistant:

bool HasExtension(const std::string &filename, const std::string &e) {
    std::string ext = e;
    if (!ext.empty() && ext[0] == '.')
        ext.erase(0, 1);

    std::string filenameExtension = filesystem::path(filename).extension();
    if (ext.size() > filenameExtension.size())
        return false;
    return std::equal(ext.rbegin(), ext.rend(), filenameExtension.rbegin(),
                      [](char a, char b) { return std::tolower(a) == std::tolower(b); });
}